

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh_arch.cc
# Opt level: O3

void __thiscall SleighArchitecture::~SleighArchitecture(SleighArchitecture *this)

{
  pointer pcVar1;
  
  (this->super_Architecture).super_AddrSpaceManager._vptr_AddrSpaceManager =
       (_func_int **)&PTR__SleighArchitecture_003cc518;
  (this->super_Architecture).translate = (Translate *)0x0;
  pcVar1 = (this->target)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->target).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filename).field_2) {
    operator_delete(pcVar1);
  }
  Architecture::~Architecture(&this->super_Architecture);
  return;
}

Assistant:

SleighArchitecture::~SleighArchitecture(void)

{
  translate = (const Translate *)0;
}